

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib533.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  int *piVar10;
  char *pcVar11;
  timeval tVar12;
  int maxfd;
  int running;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1e4;
  undefined8 local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                  ,0x2c,iVar2,uVar5);
  }
  if (iVar2 != 0) goto LAB_0010141e;
  lVar6 = curl_easy_init();
  iVar2 = 0;
  if (lVar6 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                  ,0x2e);
    iVar2 = 0x7c;
  }
  if (lVar6 == 0) {
LAB_00101406:
    lVar7 = 0;
  }
  else {
    iVar3 = curl_easy_setopt(lVar6,0x2712,URL);
    uVar9 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar5 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                    ,0x30,iVar3,uVar5);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = curl_easy_setopt(lVar6,0x29,1);
      uVar9 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                      ,0x31,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_00101406;
      iVar3 = curl_easy_setopt(lVar6,0x2d,1);
      uVar9 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar5 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                      ,0x32,iVar3,uVar5);
        iVar2 = iVar3;
      }
      if (iVar2 != 0) goto LAB_001013a5;
      lVar7 = curl_multi_init();
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                      ,0x34);
        iVar2 = 0x7b;
      }
      else {
        iVar2 = curl_multi_add_handle(lVar7,lVar6);
        uVar9 = _stderr;
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          uVar5 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar9,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                        ,0x36,iVar2,uVar5);
        }
        if (iVar2 == 0) {
          curl_mfprintf(_stderr,"Start at URL 0\n");
          iVar3 = 0;
          iVar2 = 0;
          do {
            local_1e4 = -99;
            local_1c8.tv_sec = 1;
            local_1c8.tv_usec = 0;
            iVar4 = curl_multi_perform(lVar7,&local_1d4);
            uVar9 = _stderr;
            if (iVar4 == 0) {
              if (local_1d4 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                              ,0x42);
                iVar2 = 0x7a;
              }
            }
            else {
              uVar5 = curl_multi_strerror(iVar4);
              curl_mfprintf(uVar9,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                            ,0x42,iVar4,uVar5);
              iVar2 = iVar4;
            }
            iVar4 = 0xc;
            if (iVar2 == 0) {
              tVar12 = tutil_tvnow();
              lVar8 = tutil_tvdiff(tVar12,tv_test_start);
              if (lVar8 < 0xea61) {
                if (local_1d4 == 0) {
                  iVar1 = iVar3 + 1;
                  if (iVar3 != 0) {
                    iVar2 = 0;
                    iVar4 = 0x21;
                    iVar3 = iVar1;
                    goto LAB_001017cf;
                  }
                  curl_mfprintf(_stderr,"Advancing to URL 1\n");
                  curl_multi_remove_handle(lVar7,lVar6);
                  curl_easy_reset(lVar6);
                  iVar3 = curl_easy_setopt(lVar6,0x2712,libtest_arg2);
                  uVar9 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar5 = curl_easy_strerror(iVar3);
                    curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                  ,0x4f,iVar3,uVar5);
                    iVar2 = iVar3;
                  }
                  iVar3 = iVar1;
                  if (iVar2 == 0) {
                    iVar3 = curl_easy_setopt(lVar6,0x29,1);
                    iVar2 = 0;
                    if (iVar3 != 0) {
                      local_1e0 = _stderr;
                      uVar9 = curl_easy_strerror(iVar3);
                      curl_mfprintf(local_1e0,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                    ,0x50,iVar3,uVar9);
                      iVar2 = iVar3;
                    }
                    iVar3 = iVar1;
                    if (iVar2 == 0) {
                      iVar3 = curl_easy_setopt(lVar6,0x2d,1);
                      uVar9 = _stderr;
                      iVar2 = 0;
                      if (iVar3 != 0) {
                        uVar5 = curl_easy_strerror(iVar3);
                        curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                      ,0x51,iVar3,uVar5);
                        iVar2 = iVar3;
                      }
                      iVar3 = iVar1;
                      if (iVar2 == 0) {
                        iVar2 = curl_multi_add_handle(lVar7,lVar6);
                        uVar9 = _stderr;
                        if (iVar2 == 0) {
                          iVar2 = 0;
                        }
                        else {
                          uVar5 = curl_multi_strerror(iVar2);
                          curl_mfprintf(uVar9,
                                        "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                        ,0x54,iVar2,uVar5);
                        }
                        if (iVar2 == 0) goto LAB_0010165d;
                      }
                    }
                  }
                }
                else {
LAB_0010165d:
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  iVar2 = curl_multi_fdset(lVar7,&local_b8,&local_138,&local_1b8,&local_1e4);
                  if (iVar2 == 0) {
                    iVar2 = 0;
                    if (local_1e4 < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                    ,0x5e);
                      iVar2 = 0x7a;
                    }
                  }
                  else {
                    local_1e0 = _stderr;
                    uVar9 = curl_multi_strerror(iVar2);
                    curl_mfprintf(local_1e0,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                  ,0x5e,iVar2,uVar9);
                  }
                  if (iVar2 == 0) {
                    iVar4 = select_wrapper(local_1e4 + 1,&local_b8,&local_138,&local_1b8,&local_1c8)
                    ;
                    iVar2 = 0;
                    if (iVar4 == -1) {
                      local_1e0 = CONCAT44(local_1e0._4_4_,0xffffffff);
                      piVar10 = __errno_location();
                      iVar2 = *piVar10;
                      local_1d0 = _stderr;
                      pcVar11 = strerror(iVar2);
                      curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                    ,0x62,iVar2,pcVar11);
                      iVar2 = 0x79;
                      iVar4 = (int)local_1e0;
                    }
                    if (iVar4 != -1) {
                      tVar12 = tutil_tvnow();
                      lVar8 = tutil_tvdiff(tVar12,tv_test_start);
                      iVar2 = 0;
                      if (lVar8 < 0xea61) {
                        iVar4 = 0;
                        goto LAB_001017cf;
                      }
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                                    ,100);
                      iVar2 = 0x7d;
                    }
                  }
                }
              }
              else {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib533.c"
                              ,0x44);
                iVar2 = 0x7d;
              }
              iVar4 = 0xc;
            }
LAB_001017cf:
          } while (iVar4 == 0);
          if ((iVar4 != 0x21) && (iVar4 != 0xc)) goto LAB_0010141e;
        }
      }
    }
    else {
LAB_001013a5:
      lVar7 = 0;
    }
  }
  curl_easy_cleanup(lVar6);
  curl_multi_cleanup(lVar7);
  curl_global_cleanup();
LAB_0010141e:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;
  int current = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(!current++) {
        fprintf(stderr, "Advancing to URL 1\n");
        /* remove the handle we use */
        curl_multi_remove_handle(m, curl);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl);
        easy_setopt(curl, CURLOPT_URL, libtest_arg2);
        easy_setopt(curl, CURLOPT_VERBOSE, 1L);
        easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

        /* re-add it */
        multi_add_handle(m, curl);
      }
      else
        break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}